

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QDBusMenuLayoutItem>::remove(QList<QDBusMenuLayoutItem> *this,char *__filename)

{
  QList<QDBusMenuLayoutItem> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QDBusMenuLayoutItem *in_stack_00000018;
  QMovableArrayOps<QDBusMenuLayoutItem> *in_stack_00000020;
  QArrayDataPointer<QDBusMenuLayoutItem> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QDBusMenuLayoutItem>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QDBusMenuLayoutItem>::operator->(&this->d);
    QArrayDataPointer<QDBusMenuLayoutItem>::operator->(&this->d);
    QArrayDataPointer<QDBusMenuLayoutItem>::begin
              ((QArrayDataPointer<QDBusMenuLayoutItem> *)0xb0a999);
    QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}